

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O3

void AArch64_init(MCRegisterInfo *MRI)

{
  uint16_t *in_RAX;
  uint unaff_retaddr;
  uint16_t *in_stack_00000008;
  
  MCRegisterInfo_InitMCRegisterInfo
            (MRI,AArch64RegDesc,0x1a4,0,0,AArch64MCRegisterClasses,0x39e660,(uint16_t (*) [2])0x0,
             0x39eb50,(MCPhysReg *)0x35,(char *)0x0,in_RAX,unaff_retaddr,in_stack_00000008);
  return;
}

Assistant:

void AArch64_init(MCRegisterInfo *MRI)
{
	/*
		InitMCRegisterInfo(AArch64RegDesc, 420,
			RA, PC,
			AArch64MCRegisterClasses, 43,
			AArch64RegUnitRoots, 66, AArch64RegDiffLists,
			AArch64RegStrings,
			AArch64SubRegIdxLists, 53,
			AArch64SubRegIdxRanges,
			AArch64RegEncodingTable);
	*/

	MCRegisterInfo_InitMCRegisterInfo(MRI, AArch64RegDesc, 420,
			0, 0, 
			AArch64MCRegisterClasses, 43,
			0, 0, AArch64RegDiffLists,
			0, 
			AArch64SubRegIdxLists, 53,
			0);
}